

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O1

void LDSketch_copy(LDSketch_t *tbl,LDSketch_t *ret_tbl)

{
  long lVar1;
  
  if (ret_tbl == (LDSketch_t *)0x0) {
    LDSketch_copy();
  }
  else if (0 < tbl->w * tbl->h) {
    lVar1 = 0;
    do {
      dyn_tbl_copy(tbl->tbl[lVar1],ret_tbl->tbl[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (long)tbl->w * (long)tbl->h);
  }
  return;
}

Assistant:

void LDSketch_copy(LDSketch_t* tbl, LDSketch_t* ret_tbl) {
	if (ret_tbl == NULL) {
		fprintf(stderr, "ERR: ret_tbl in LDSketch_copy() is NULL\n");
		return;
	}

	// memcpy(ret_tbl->T, tbl->T, tbl->size * sizeof(long long));
	for (int i = 0; i < tbl->h * tbl->w; ++i) {
		dyn_tbl_copy(tbl->tbl[i], ret_tbl->tbl[i]);
	}
	// ret_tbl->total = tbl->total;
}